

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

int32_t icu_63::number::impl::CurrencySpacingEnabledModifier::applyCurrencySpacingAffix
                  (NumberStringBuilder *output,int32_t index,EAffix affix,
                  DecimalFormatSymbols *symbols,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  int32_t iVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  UnicodeString *that;
  EAffix affix_00;
  UnicodeString spacingString;
  UnicodeSet numberUniset;
  UnicodeSet affixUniset;
  UnicodeString local_120;
  UnicodeSet local_e0;
  UnicodeSet local_88;
  
  if (affix == PREFIX) {
    if (output->fUsingHeap == false) {
      pVVar4 = &output->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(output->fFields).heap.ptr;
    }
    if (*(int *)((long)pVVar4 + ((long)output->fZero + (long)index) * 4 + -4) != 7) {
      return 0;
    }
    UVar2 = NumberStringBuilder::codePointBefore(output,index);
    affix_00 = PREFIX;
  }
  else {
    if (output->fUsingHeap == false) {
      pVVar4 = &output->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(output->fFields).heap.ptr;
    }
    if (pVVar4->value[(long)index + (long)output->fZero] != UNUM_CURRENCY_FIELD) {
      return 0;
    }
    UVar2 = NumberStringBuilder::codePointAt(output,index);
    affix_00 = affix;
  }
  iVar3 = 0;
  getUnicodeSet(&local_88,symbols,IN_CURRENCY,affix_00,status);
  UVar1 = UnicodeSet::contains(&local_88,UVar2);
  if (UVar1 != '\0') {
    if (affix == PREFIX) {
      UVar2 = NumberStringBuilder::codePointAt(output,index);
    }
    else {
      UVar2 = NumberStringBuilder::codePointBefore(output,index);
    }
    getUnicodeSet(&local_e0,symbols,IN_NUMBER,affix,status);
    UVar1 = UnicodeSet::contains(&local_e0,UVar2);
    if (UVar1 == '\0') {
      iVar3 = 0;
    }
    else {
      that = DecimalFormatSymbols::getPatternForCurrencySpacing
                       (symbols,UNUM_CURRENCY_INSERT,affix == SUFFIX,status);
      UnicodeString::UnicodeString(&local_120,that);
      iVar3 = NumberStringBuilder::insert(output,index,&local_120,UNUM_FIELD_COUNT,status);
      UnicodeString::~UnicodeString(&local_120);
    }
    UnicodeSet::~UnicodeSet(&local_e0);
  }
  UnicodeSet::~UnicodeSet(&local_88);
  return iVar3;
}

Assistant:

int32_t
CurrencySpacingEnabledModifier::applyCurrencySpacingAffix(NumberStringBuilder &output, int32_t index,
                                                          EAffix affix,
                                                          const DecimalFormatSymbols &symbols,
                                                          UErrorCode &status) {
    // NOTE: For prefix, output.fieldAt(index-1) gets the last field type in the prefix.
    // This works even if the last code point in the prefix is 2 code units because the
    // field value gets populated to both indices in the field array.
    Field affixField = (affix == PREFIX) ? output.fieldAt(index - 1) : output.fieldAt(index);
    if (affixField != UNUM_CURRENCY_FIELD) {
        return 0;
    }
    int affixCp = (affix == PREFIX) ? output.codePointBefore(index) : output.codePointAt(index);
    UnicodeSet affixUniset = getUnicodeSet(symbols, IN_CURRENCY, affix, status);
    if (!affixUniset.contains(affixCp)) {
        return 0;
    }
    int numberCp = (affix == PREFIX) ? output.codePointAt(index) : output.codePointBefore(index);
    UnicodeSet numberUniset = getUnicodeSet(symbols, IN_NUMBER, affix, status);
    if (!numberUniset.contains(numberCp)) {
        return 0;
    }
    UnicodeString spacingString = getInsertString(symbols, affix, status);

    // NOTE: This next line *inserts* the spacing string, triggering an arraycopy.
    // It would be more efficient if this could be done before affixes were attached,
    // so that it could be prepended/appended instead of inserted.
    // However, the build code path is more efficient, and this is the most natural
    // place to put currency spacing in the non-build code path.
    // TODO: Should we use the CURRENCY field here?
    return output.insert(index, spacingString, UNUM_FIELD_COUNT, status);
}